

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc_compat.c
# Opt level: O0

int verify_monster(void *buffer)

{
  MyGame_Example_Color_enum_t MVar1;
  int8_t iVar2;
  byte bVar3;
  MyGame_Example_Any_union_type_t MVar4;
  int16_t iVar5;
  int iVar6;
  int32_t iVar7;
  uint32_t uVar8;
  MyGame_Example_Monster_table_t t__tmp;
  MyGame_Example_Vec3_struct_t t__tmp_00;
  MyGame_Example_Test_struct_t pMVar9;
  flatbuffers_string_t pcVar10;
  size_t sVar11;
  flatbuffers_uint8_vec_t vec__tmp;
  flatbuffers_string_vec_t vec_00;
  MyGame_Example_Monster_table_t t__tmp_01;
  MyGame_Example_Test_vec_t vec_01;
  int64_t iVar12;
  uint64_t uVar13;
  float fVar14;
  double dVar15;
  ulong local_78;
  size_t i;
  flatbuffers_string_t s;
  flatbuffers_string_vec_t aofs;
  flatbuffers_uint8_vec_t inv;
  size_t offset;
  flatbuffers_string_t name;
  MyGame_Example_Any_union_type_t mini_type;
  MyGame_Example_Test_vec_t testvec;
  MyGame_Example_Test_struct_t test;
  MyGame_Example_Vec3_struct_t vec;
  MyGame_Example_Monster_table_t mini;
  MyGame_Example_Monster_table_t monster;
  void *buffer_local;
  
  t__tmp = MyGame_Example_Monster_as_root(buffer);
  if (t__tmp == (MyGame_Example_Monster_table_t)0x0) {
    printf("Monster not available\n");
  }
  else {
    iVar5 = MyGame_Example_Monster_hp(t__tmp);
    if (iVar5 == 0x50) {
      t__tmp_00 = MyGame_Example_Monster_pos(t__tmp);
      if (t__tmp_00 == (MyGame_Example_Vec3_struct_t)0x0) {
        printf("Position is absent\n");
      }
      else if (((long)t__tmp_00 - (long)buffer & 0xfU) == 0) {
        fVar14 = MyGame_Example_Vec3_x(t__tmp_00);
        if ((fVar14 != 1.0) || (NAN(fVar14))) {
          printf("Position failing on x coordinate\n");
        }
        else {
          fVar14 = MyGame_Example_Vec3_y(t__tmp_00);
          if ((fVar14 != 2.0) || (NAN(fVar14))) {
            printf("Position failing on y coordinate\n");
          }
          else {
            fVar14 = MyGame_Example_Vec3_z(t__tmp_00);
            if ((fVar14 != 3.0) || (NAN(fVar14))) {
              printf("Position failing on z coordinate\n");
            }
            else {
              dVar15 = MyGame_Example_Vec3_test1(t__tmp_00);
              if ((dVar15 != 3.0) || (NAN(dVar15))) {
                printf("Vec3 test1 is not 3\n");
              }
              else {
                MVar1 = MyGame_Example_Vec3_test2(t__tmp_00);
                if (MVar1 == '\x02') {
                  pMVar9 = MyGame_Example_Vec3_test3(t__tmp_00);
                  iVar5 = MyGame_Example_Test_a(pMVar9);
                  if ((iVar5 == 5) && (iVar2 = MyGame_Example_Test_b(pMVar9), iVar2 == '\x06')) {
                    pcVar10 = MyGame_Example_Monster_name(t__tmp);
                    sVar11 = flatbuffers_string_len(pcVar10);
                    if (sVar11 != 9) {
                      printf("Name length is not correct\n");
                      return -1;
                    }
                    if ((pcVar10 == (flatbuffers_string_t)0x0) ||
                       (iVar6 = strcmp(pcVar10,"MyMonster"), iVar6 != 0)) {
                      printf("Name is not correct\n");
                      return -1;
                    }
                    vec__tmp = MyGame_Example_Monster_inventory(t__tmp);
                    sVar11 = flatbuffers_uint8_vec_len(vec__tmp);
                    if (sVar11 != 5) {
                      printf("Inventory has wrong length\n");
                      return -1;
                    }
                    for (local_78 = 0; local_78 < 5; local_78 = local_78 + 1) {
                      bVar3 = flatbuffers_uint8_vec_at(vec__tmp,local_78);
                      if (bVar3 != local_78) {
                        printf("Inventory item #%d is wrong\n",local_78 & 0xffffffff);
                        return -1;
                      }
                    }
                    vec_00 = MyGame_Example_Monster_testarrayofstring(t__tmp);
                    if (vec_00 == (flatbuffers_string_vec_t)0x0) {
                      printf("Array of string not present\n");
                      return -1;
                    }
                    sVar11 = flatbuffers_string_vec_len(vec_00);
                    if (sVar11 != 2) {
                      printf("Array of string has wrong vector length\n");
                      return -1;
                    }
                    pcVar10 = flatbuffers_string_vec_at(vec_00,0);
                    iVar6 = strcmp(pcVar10,"test1");
                    if (iVar6 != 0) {
                      printf("First string array element is wrong\n");
                      return -1;
                    }
                    pcVar10 = flatbuffers_string_vec_at(vec_00,1);
                    iVar6 = strcmp(pcVar10,"test2");
                    if (iVar6 != 0) {
                      printf("Second string array element is wrong\n");
                      return -1;
                    }
                    MVar4 = MyGame_Example_Monster_test_type(t__tmp);
                    if (MVar4 != '\x01') {
                      printf("Not any monster\n");
                      return -1;
                    }
                    t__tmp_01 = (MyGame_Example_Monster_table_t)MyGame_Example_Monster_test(t__tmp);
                    if (t__tmp_01 == (MyGame_Example_Monster_table_t)0x0) {
                      printf("test monster not there\n");
                      return -1;
                    }
                    pcVar10 = MyGame_Example_Monster_name(t__tmp_01);
                    iVar6 = strcmp(pcVar10,"Fred");
                    if (iVar6 != 0) {
                      printf("test monster isn\'t Fred\n");
                      return -1;
                    }
                    vec_01 = MyGame_Example_Monster_test4(t__tmp);
                    sVar11 = MyGame_Example_Test_vec_len(vec_01);
                    if (sVar11 != 2) {
                      printf("Test struct vector has wrong length\n");
                      return -1;
                    }
                    pMVar9 = MyGame_Example_Test_vec_at(vec_01,0);
                    iVar5 = MyGame_Example_Test_a(pMVar9);
                    if (iVar5 != 10) {
                      printf("Testvec[0].a is wrong\n");
                      return -1;
                    }
                    iVar2 = MyGame_Example_Test_b(pMVar9);
                    if (iVar2 != '\x14') {
                      printf("Testvec[0].b is wrong\n");
                      return -1;
                    }
                    pMVar9 = MyGame_Example_Test_vec_at(vec_01,1);
                    iVar5 = MyGame_Example_Test_a(pMVar9);
                    if (iVar5 != 0x1e) {
                      printf("Testvec[1].a is wrong\n");
                      return -1;
                    }
                    iVar2 = MyGame_Example_Test_b(pMVar9);
                    if (iVar2 != '(') {
                      printf("Testvec[1].b is wrong\n");
                      return -1;
                    }
                    iVar7 = MyGame_Example_Monster_testhashs32_fnv1(t__tmp);
                    if (iVar7 == -0x228636bf) {
                      uVar8 = MyGame_Example_Monster_testhashu32_fnv1(t__tmp);
                      if (uVar8 != 0xdd79c941) {
                        __assert_fail("ns(Monster_testhashu32_fnv1(monster)) == 3715746113L",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/flatc_compat/flatc_compat.c"
                                      ,0x95,"int verify_monster(void *)");
                      }
                      iVar12 = MyGame_Example_Monster_testhashs64_fnv1(t__tmp);
                      if (iVar12 != 0x6e0f80cdf27b9181) {
                        __assert_fail("ns(Monster_testhashs64_fnv1(monster)) == 7930699090847568257LL"
                                      ,
                                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/flatc_compat/flatc_compat.c"
                                      ,0x96,"int verify_monster(void *)");
                      }
                      uVar13 = MyGame_Example_Monster_testhashu64_fnv1(t__tmp);
                      if (uVar13 != 0x6e0f80cdf27b9181) {
                        __assert_fail("ns(Monster_testhashu64_fnv1(monster)) == 7930699090847568257LL"
                                      ,
                                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/flatc_compat/flatc_compat.c"
                                      ,0x97,"int verify_monster(void *)");
                      }
                      iVar7 = MyGame_Example_Monster_testhashs32_fnv1a(t__tmp);
                      if (iVar7 == -0x717e5b8f) {
                        uVar8 = MyGame_Example_Monster_testhashu32_fnv1a(t__tmp);
                        if (uVar8 != 0x8e81a471) {
                          __assert_fail("ns(Monster_testhashu32_fnv1a(monster)) == 2390860913L",
                                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/flatc_compat/flatc_compat.c"
                                        ,0x99,"int verify_monster(void *)");
                        }
                        iVar12 = MyGame_Example_Monster_testhashs64_fnv1a(t__tmp);
                        if (iVar12 == 0x43f948dcc767ddf1) {
                          uVar13 = MyGame_Example_Monster_testhashu64_fnv1a(t__tmp);
                          if (uVar13 == 0x43f948dcc767ddf1) {
                            return 0;
                          }
                          __assert_fail("ns(Monster_testhashu64_fnv1a(monster)) == 4898026182817603057LL"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/flatc_compat/flatc_compat.c"
                                        ,0x9b,"int verify_monster(void *)");
                        }
                        __assert_fail("ns(Monster_testhashs64_fnv1a(monster)) == 4898026182817603057LL"
                                      ,
                                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/flatc_compat/flatc_compat.c"
                                      ,0x9a,"int verify_monster(void *)");
                      }
                      __assert_fail("ns(Monster_testhashs32_fnv1a(monster)) == -1904106383L",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/flatc_compat/flatc_compat.c"
                                    ,0x98,"int verify_monster(void *)");
                    }
                    __assert_fail("ns(Monster_testhashs32_fnv1(monster)) == -579221183L",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/flatc_compat/flatc_compat.c"
                                  ,0x94,"int verify_monster(void *)");
                  }
                  printf("test3 not valid in Vec3\n");
                }
                else {
                  printf("Vec3 test2 not Green\n");
                }
              }
            }
          }
        }
      }
      else {
        printf("Force align of Vec3 struct not correct\n");
      }
    }
    else {
      printf("Health points are not as expected\n");
    }
  }
  return -1;
}

Assistant:

int verify_monster(void *buffer)
{
    ns(Monster_table_t) monster, mini;
    ns(Vec3_struct_t) vec;
    ns(Test_struct_t) test;
    ns(Test_vec_t) testvec;
    ns(Any_union_type_t) mini_type;
    flatbuffers_string_t name;
    size_t offset;
    flatbuffers_uint8_vec_t inv;
    flatbuffers_string_vec_t aofs;
    flatbuffers_string_t s;
    size_t i;

    if (!(monster = ns(Monster_as_root(buffer)))) {
        printf("Monster not available\n");
        return -1;
    }
    if (ns(Monster_hp(monster)) != 80) {
        printf("Health points are not as expected\n");
        return -1;
    }
    if (!(vec = ns(Monster_pos(monster)))) {
        printf("Position is absent\n");
        return -1;
    }
    offset = (size_t)((char *)vec - (char *)buffer);
    if (offset & 15) {
        printf("Force align of Vec3 struct not correct\n");
        return -1;
    }
    if (ns(Vec3_x(vec)) != 1) {
        printf("Position failing on x coordinate\n");
        return -1;
    }
    if (ns(Vec3_y(vec)) != 2) {
        printf("Position failing on y coordinate\n");
        return -1;
    }
    if (ns(Vec3_z(vec)) != 3) {
        printf("Position failing on z coordinate\n");
        return -1;
    }
    if (ns(Vec3_test1(vec)) != 3) {
        printf("Vec3 test1 is not 3\n");
        return -1;
    }
    if (ns(Vec3_test2(vec)) != ns(Color_Green)) {
        printf("Vec3 test2 not Green\n");
        return -1;
    }
    test = ns(Vec3_test3(vec));
    if (ns(Test_a(test)) != 5 || ns(Test_b(test) != 6)) {
        printf("test3 not valid in Vec3\n");
        return -1;
    }
    name = ns(Monster_name(monster));
    if (flatbuffers_string_len(name) != 9) {
        printf("Name length is not correct\n");
        return -1;
    }
    if (!name || strcmp(name, "MyMonster")) {
        printf("Name is not correct\n");
        return -1;
    }
    inv = ns(Monster_inventory(monster));
    if (flatbuffers_uint8_vec_len(inv) != 5) {
        printf("Inventory has wrong length\n");
        return -1;
    }
    for (i = 0; i < 5; ++i) {
        if (flatbuffers_uint8_vec_at(inv, i) != i) {
            printf("Inventory item #%d is wrong\n", (int)i);
            return -1;
        }
    }
    if (!(aofs = ns(Monster_testarrayofstring(monster)))) {
        printf("Array of string not present\n");
        return -1;
    }
    if (flatbuffers_string_vec_len(aofs) != 2) {
        printf("Array of string has wrong vector length\n");
        return -1;
    }
    s = flatbuffers_string_vec_at(aofs, 0);
    if (strcmp(s, "test1")) {
        printf("First string array element is wrong\n");
        return -1;
    }
    s = flatbuffers_string_vec_at(aofs, 1);
    if (strcmp(s, "test2")) {
        printf("Second string array element is wrong\n");
        return -1;
    }
    mini_type = ns(Monster_test_type(monster));
    if (mini_type != ns(Any_Monster)) {
        printf("Not any monster\n");
        return -1;
    }
    mini = ns(Monster_test(monster));
    if (!mini) {
        printf("test monster not there\n");
        return -1;
    }
    if (strcmp(ns(Monster_name(mini)), "Fred")) {
        printf("test monster isn't Fred\n");
        return -1;
    }
    testvec = ns(Monster_test4(monster));
    if (ns(Test_vec_len(testvec)) != 2) {
        printf("Test struct vector has wrong length\n");
        return -1;
    }
    test = ns(Test_vec_at(testvec, 0));
    if (ns(Test_a(test) != 10)) {
        printf("Testvec[0].a is wrong\n");
        return -1;
    }
    if (ns(Test_b(test) != 20)) {
        printf("Testvec[0].b is wrong\n");
        return -1;
    }
    test = ns(Test_vec_at(testvec, 1));
    if (ns(Test_a(test) != 30)) {
        printf("Testvec[1].a is wrong\n");
        return -1;
    }
    if (ns(Test_b(test) != 40)) {
        printf("Testvec[1].b is wrong\n");
        return -1;
    }
    assert(ns(Monster_testhashs32_fnv1(monster)) == -579221183L);
    assert(ns(Monster_testhashu32_fnv1(monster)) == 3715746113L);
    assert(ns(Monster_testhashs64_fnv1(monster)) == 7930699090847568257LL);
    assert(ns(Monster_testhashu64_fnv1(monster)) == 7930699090847568257LL);
    assert(ns(Monster_testhashs32_fnv1a(monster)) == -1904106383L);
    assert(ns(Monster_testhashu32_fnv1a(monster)) ==  2390860913L);
    assert(ns(Monster_testhashs64_fnv1a(monster)) ==  4898026182817603057LL);
    assert(ns(Monster_testhashu64_fnv1a(monster)) ==  4898026182817603057LL);
    return 0;
}